

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderExecUtil.cpp
# Opt level: O3

void deqp::gls::ShaderExecUtil::generateFragShaderOutAssign
               (ostream *src,ShaderSpec *shaderSpec,bool useIntOutputs,string *valuePrefix,
               string *outputPrefix)

{
  int iVar1;
  DataType DVar2;
  ostream *poVar3;
  size_t sVar4;
  long lVar5;
  pointer pSVar6;
  char *pcVar7;
  int iVar8;
  
  pSVar6 = (shaderSpec->outputs).
           super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar6 != (shaderSpec->outputs).
                super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      DVar2 = (pSVar6->varType).m_data.basic.type;
      if ((useIntOutputs) && (DVar2 - TYPE_FLOAT < 4)) {
        std::__ostream_insert<char,std::char_traits<char>>(src,"\to_",3);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (src,(pSVar6->name)._M_dataplus._M_p,(pSVar6->name)._M_string_length);
        lVar5 = 0x13;
        pcVar7 = " = floatBitsToUint(";
LAB_0080934d:
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar5);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(valuePrefix->_M_dataplus)._M_p,valuePrefix->_M_string_length);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar3,(pSVar6->name)._M_dataplus._M_p,(pSVar6->name)._M_string_length);
        lVar5 = 3;
        pcVar7 = ");\n";
LAB_0080937f:
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar5);
      }
      else {
        if (8 < DVar2 - TYPE_FLOAT_MAT2 && 8 < DVar2 - TYPE_DOUBLE_MAT2) {
          if (DVar2 - TYPE_BOOL < 4) {
            iVar1 = glu::getDataTypeScalarSize(DVar2);
            DVar2 = TYPE_INT;
            if (1 < iVar1) {
              DVar2 = glu::getDataTypeIntVec(iVar1);
            }
            std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (src,(outputPrefix->_M_dataplus)._M_p,outputPrefix->_M_string_length)
            ;
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,(pSVar6->name)._M_dataplus._M_p,
                                (pSVar6->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
            pcVar7 = glu::getDataTypeName(DVar2);
            if (pcVar7 == (char *)0x0) {
              std::ios::clear((int)poVar3 + (int)*(undefined8 *)(*(long *)poVar3 + -0x18));
            }
            else {
              sVar4 = strlen(pcVar7);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,sVar4);
            }
            lVar5 = 1;
            pcVar7 = "(";
            goto LAB_0080934d;
          }
          std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (src,(outputPrefix->_M_dataplus)._M_p,outputPrefix->_M_string_length);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(pSVar6->name)._M_dataplus._M_p,(pSVar6->name)._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(valuePrefix->_M_dataplus)._M_p,valuePrefix->_M_string_length);
          poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar3,(pSVar6->name)._M_dataplus._M_p,(pSVar6->name)._M_string_length
                             );
          lVar5 = 2;
          pcVar7 = ";\n";
          goto LAB_0080937f;
        }
        iVar1 = glu::getDataTypeMatrixNumColumns(DVar2);
        if (0 < iVar1) {
          iVar8 = 0;
          do {
            std::__ostream_insert<char,std::char_traits<char>>(src,"\t",1);
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (src,(outputPrefix->_M_dataplus)._M_p,outputPrefix->_M_string_length)
            ;
            poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar3,(pSVar6->name)._M_dataplus._M_p,
                                (pSVar6->name)._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,"_",1);
            poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
            if (useIntOutputs) {
              std::__ostream_insert<char,std::char_traits<char>>(poVar3," = floatBitsToUint(",0x13);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar3,(valuePrefix->_M_dataplus)._M_p,
                                  valuePrefix->_M_string_length);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar3,(pSVar6->name)._M_dataplus._M_p,
                                  (pSVar6->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[",1);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
              lVar5 = 4;
              pcVar7 = "]);\n";
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>(poVar3," = ",3);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar3,(valuePrefix->_M_dataplus)._M_p,
                                  valuePrefix->_M_string_length);
              poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                                 (poVar3,(pSVar6->name)._M_dataplus._M_p,
                                  (pSVar6->name)._M_string_length);
              std::__ostream_insert<char,std::char_traits<char>>(poVar3,"[",1);
              poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar8);
              lVar5 = 3;
              pcVar7 = "];\n";
            }
            std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar7,lVar5);
            iVar8 = iVar8 + 1;
          } while (iVar1 != iVar8);
        }
      }
      pSVar6 = pSVar6 + 1;
    } while (pSVar6 != (shaderSpec->outputs).
                       super__Vector_base<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  }
  return;
}

Assistant:

static void generateFragShaderOutAssign (std::ostream& src, const ShaderSpec& shaderSpec, bool useIntOutputs, const std::string& valuePrefix, const std::string& outputPrefix)
{
	for (vector<Symbol>::const_iterator output = shaderSpec.outputs.begin(); output != shaderSpec.outputs.end(); ++output)
	{
		if (useIntOutputs && glu::isDataTypeFloatOrVec(output->varType.getBasicType()))
			src << "	o_" << output->name << " = floatBitsToUint(" << valuePrefix << output->name << ");\n";
		else if (glu::isDataTypeMatrix(output->varType.getBasicType()))
		{
			const int	numVecs		= glu::getDataTypeMatrixNumColumns(output->varType.getBasicType());

			for (int vecNdx = 0; vecNdx < numVecs; ++vecNdx)
				if (useIntOutputs)
					src << "\t" << outputPrefix << output->name << "_" << vecNdx << " = floatBitsToUint(" << valuePrefix << output->name << "[" << vecNdx << "]);\n";
				else
					src << "\t" << outputPrefix << output->name << "_" << vecNdx << " = " << valuePrefix << output->name << "[" << vecNdx << "];\n";
		}
		else if (glu::isDataTypeBoolOrBVec(output->varType.getBasicType()))
		{
			const int				vecSize		= glu::getDataTypeScalarSize(output->varType.getBasicType());
			const glu::DataType		intBaseType	= vecSize > 1 ? glu::getDataTypeIntVec(vecSize) : glu::TYPE_INT;

			src << "\t" << outputPrefix << output->name << " = " << glu::getDataTypeName(intBaseType) << "(" << valuePrefix << output->name << ");\n";
		}
		else
			src << "\t" << outputPrefix << output->name << " = " << valuePrefix << output->name << ";\n";
	}
}